

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quicly.c
# Opt level: O3

int on_ack_new_connection_id
              (quicly_sentmap_t *map,quicly_sent_packet_t *packet,int acked,quicly_sent_t *sent)

{
  byte *pbVar1;
  uint64_t sequence;
  int iVar2;
  
  sequence = (sent->data).packet.packet_number;
  if (acked == 0) {
    iVar2 = quicly_local_cid_on_lost((quicly_local_cid_set_t *)&map[-0x28]._pending_packet,sequence)
    ;
    if (iVar2 != 0) {
      pbVar1 = (byte *)((long)&map[9]._pending_packet + 4);
      *pbVar1 = *pbVar1 | 0x80;
    }
  }
  else {
    quicly_local_cid_on_acked((quicly_local_cid_set_t *)&map[-0x28]._pending_packet,sequence);
  }
  return 0;
}

Assistant:

static int on_ack_new_connection_id(quicly_sentmap_t *map, const quicly_sent_packet_t *packet, int acked, quicly_sent_t *sent)
{
    quicly_conn_t *conn = (quicly_conn_t *)((char *)map - offsetof(quicly_conn_t, egress.loss.sentmap));
    uint64_t sequence = sent->data.new_connection_id.sequence;

    if (acked) {
        quicly_local_cid_on_acked(&conn->super.local.cid_set, sequence);
    } else {
        if (quicly_local_cid_on_lost(&conn->super.local.cid_set, sequence))
            conn->egress.pending_flows |= QUICLY_PENDING_FLOW_CID_FRAME_BIT;
    }

    return 0;
}